

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void usage(char *binaryName)

{
  printf("Usage: %s [options] <scenefile>\n",binaryName);
  puts("Program Options:");
  puts("  -s  <INT>        Number of camera rays per pixel");
  puts("  -l  <INT>        Number of samples per area light");
  puts("  -t  <INT>        Number of render threads");
  puts("  -m  <INT>        Maximum ray depth");
  puts("  -e  <PATH>       Path to environment map");
  puts("  -h               Print this help message");
  putchar(10);
  return;
}

Assistant:

void usage(const char* binaryName) {
  printf("Usage: %s [options] <scenefile>\n", binaryName);
  printf("Program Options:\n");
  printf("  -s  <INT>        Number of camera rays per pixel\n");
  printf("  -l  <INT>        Number of samples per area light\n");
  printf("  -t  <INT>        Number of render threads\n");
  printf("  -m  <INT>        Maximum ray depth\n");
  printf("  -e  <PATH>       Path to environment map\n");
  printf("  -h               Print this help message\n");
  printf("\n");
}